

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O3

void __thiscall
ExampleNLFeeder::
WriteDense2Sparse<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,double[2]>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,double (*vec) [2])

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  SparseVectorWriter<int,_double> gvw;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *local_28;
  char *local_20;
  
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)gw);
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (((*vec)[lVar2] != 0.0) || (NAN((*vec)[lVar2]))) {
      local_20 = local_20 + -1;
      mp::TextFormatter::apr(&local_28->super_FormatterType,&local_28->nm,"%d %g\n");
    }
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void WriteDense2Sparse(GradWriterFactory& gw, const DenseVec& vec) {
    auto gvw = gw.MakeVectorWriter(CountNNZ(vec));
    WriteDense2Sparse_Pure(gvw, vec);
  }